

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcomparehelpers.h
# Opt level: O1

void __thiscall QRawFont::setPixelSize(QRawFont *this,qreal pixelSize)

{
  QAtomicInt *pQVar1;
  double dVar2;
  QRawFontPrivate *pQVar3;
  QFontEngine *pQVar4;
  undefined1 auVar5 [16];
  ulong uVar6;
  int iVar7;
  undefined4 extraout_var;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  double dVar12;
  double dVar13;
  undefined1 auVar14 [16];
  QFontEngine *pQVar8;
  
  pQVar3 = (this->d).d.ptr;
  pQVar4 = pQVar3->fontEngine;
  if (pQVar4 != (QFontEngine *)0x0) {
    dVar2 = (pQVar4->fontDef).pixelSize;
    dVar12 = dVar2 - pixelSize;
    uVar9 = -(ulong)(dVar12 < -dVar12);
    uVar10 = -(ulong)(dVar2 < -dVar2);
    uVar11 = -(ulong)(pixelSize < -pixelSize);
    uVar6 = (ulong)-pixelSize & uVar11;
    auVar14._0_8_ = ~uVar10 & (ulong)dVar2;
    auVar14._8_8_ = ~uVar11 & (ulong)pixelSize;
    auVar5._8_4_ = (int)uVar6;
    auVar5._0_8_ = (ulong)-dVar2 & uVar10;
    auVar5._12_4_ = (int)(uVar6 >> 0x20);
    dVar13 = SUB168(auVar14 | auVar5,0);
    dVar2 = SUB168(auVar14 | auVar5,8);
    if (dVar2 <= dVar13) {
      dVar13 = dVar2;
    }
    if (dVar13 < (double)(~uVar9 & (ulong)dVar12 | (ulong)-dVar12 & uVar9) * 1000000000000.0) {
      if ((pQVar3->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
          super___atomic_base<int>._M_i != 1) {
        QExplicitlySharedDataPointer<QRawFontPrivate>::detach_helper(&this->d);
      }
      pQVar3 = (this->d).d.ptr;
      iVar7 = (*pQVar3->fontEngine->_vptr_QFontEngine[0x2e])(pixelSize);
      pQVar8 = (QFontEngine *)CONCAT44(extraout_var,iVar7);
      pQVar4 = pQVar3->fontEngine;
      if (pQVar4 != pQVar8) {
        if (pQVar4 != (QFontEngine *)0x0) {
          LOCK();
          pQVar1 = &pQVar4->ref;
          (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
          super___atomic_base<int> =
               (__atomic_base<int>)
               ((__int_type)
                (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
                super___atomic_base<int> + -1);
          UNLOCK();
          if (((__int_type)
               (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
               super___atomic_base<int> == 0) && (pQVar3->fontEngine != (QFontEngine *)0x0)) {
            (*pQVar3->fontEngine->_vptr_QFontEngine[1])();
          }
        }
        pQVar3->fontEngine = pQVar8;
        if (pQVar8 != (QFontEngine *)0x0) {
          LOCK();
          (pQVar8->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
          super___atomic_base<int> =
               (__atomic_base<int>)
               ((__int_type)
                (pQVar8->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
                super___atomic_base<int> + 1);
          UNLOCK();
        }
      }
    }
  }
  return;
}

Assistant:

constexpr P get() const noexcept { return ptr; }